

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

ER __thiscall
slang::ast::ForeachLoopStatement::evalRecursive
          (ForeachLoopStatement *this,EvalContext *context,ConstantValue *cv,
          span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims)

{
  SVQueue *pSVar1;
  _Map_pointer ppCVar2;
  bool bVar3;
  ER EVar4;
  uint uVar5;
  int32_t iVar6;
  ER EVar7;
  variant_alternative_t<5UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar8;
  variant_alternative_t<7UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar9;
  _Base_ptr p_Var10;
  variant_alternative_t<8UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar11;
  reference cv_00;
  variant_alternative_t<6UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar12;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar13;
  pointer pLVar14;
  EvalContext *pEVar15;
  _Rb_tree_node_base *p_Var16;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar17;
  ER unaff_R13D;
  int iVar18;
  void *pvVar19;
  ConstantRange CVar20;
  bool bVar21;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> sVar22;
  undefined1 local_f9;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_f8;
  uint local_f0;
  undefined2 local_ec;
  EvalContext *local_e8;
  ForeachLoopStatement *local_e0;
  _Rb_tree_node_base *local_d8;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_d0;
  undefined1 local_b0;
  ConstantValue *local_a8;
  ConstantValue *local_a0;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> local_98;
  _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*> *local_88;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_80;
  pointer local_78;
  void *local_70;
  void *local_68;
  pointer local_60;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  local_98.size_ = currDims.size_;
  pLVar14 = currDims.data_;
  local_e0 = this;
  local_98.data_ = pLVar14;
  if (local_98.size_ == 0) {
LAB_0027ff93:
    std::terminate();
  }
  if (pLVar14->loopVar == (IteratorSymbol *)0x0) {
    local_b0 = 0;
    sVar22 = nonstd::span_lite::
             span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::subspan
                       (&local_98,1,0xffffffffffffffff);
    EVar4 = evalRecursive(local_e0,context,(ConstantValue *)&local_d0,sVar22);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_d0);
    return EVar4;
  }
  local_58._M_index = '\0';
  local_a0 = EvalContext::createLocal
                       (context,(ValueSymbol *)pLVar14->loopVar,(ConstantValue *)&local_58);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_58);
  EVar4 = 0x3e9f84;
  EVar7 = 0x3e9f84;
  local_e8 = context;
  switch(*(__index_type *)
          ((long)&(cv->value).
                  super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          + 0x20)) {
  case '\x05':
    pvVar8 = std::
             get<5ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       (&cv->value);
    local_78 = (pvVar8->
               super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               _M_impl.super__Vector_impl_data._M_start;
    local_68 = (void *)(((long)(pvVar8->
                               super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)local_78 >> 3) *
                       -0x3333333333333333);
    goto LAB_0027fd0b;
  case '\x06':
    if (local_98.size_ != 1) {
      assert::assertFailed
                ("currDims.size() == 1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Statements.cpp"
                 ,0x76d,
                 "ER slang::ast::ForeachLoopStatement::evalRecursive(EvalContext &, const ConstantValue &, span<const LoopDim>) const"
                );
    }
    pvVar12 = std::
              get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        (&cv->value);
    bVar21 = pvVar12->_M_string_length != 0;
    if (bVar21) {
      bVar21 = true;
      aVar17.val = 0;
      do {
        local_f0 = 0x20;
        local_ec = 1;
        local_f8 = aVar17;
        SVInt::clearUnusedBits((SVInt *)&local_f8);
        local_d0._0_8_ = local_f8;
        local_d0._8_4_ = local_f0;
        local_d0._12_1_ = (undefined1)local_ec;
        local_d0._13_1_ = local_ec._1_1_;
        if (0x40 < local_f0 || (local_ec & 0x100) != 0) {
          local_f8.val = 0;
        }
        local_b0 = 1;
        local_a8 = local_a0;
        std::operator=(&local_a8,&local_d0,&local_f9);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_d0);
        if (((0x40 < local_f0) || ((local_ec & 0x100) != 0)) &&
           ((void *)local_f8.val != (void *)0x0)) {
          operator_delete__(local_f8.pVal);
        }
        EVar7 = Statement::eval(local_e0->body,context);
        if ((EVar7 == Continue) || (EVar4 = EVar7, EVar7 == Success)) {
          EVar4 = unaff_R13D;
        }
        if ((EVar7 != Continue) && (EVar7 != Success)) break;
        aVar17.pVal = (uint64_t *)(aVar17.val + 1);
        bVar21 = aVar17.val < (void *)pvVar12->_M_string_length;
        unaff_R13D = EVar4;
      } while (bVar21);
    }
    if (bVar21) {
      return EVar4;
    }
    break;
  case '\a':
    pvVar9 = std::
             get<7ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       (&cv->value);
    p_Var10 = (pvVar9->ptr->
              super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
              )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var16 = &(pvVar9->ptr->
               super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
               )._M_t._M_impl.super__Rb_tree_header._M_header;
    bVar21 = p_Var10 == p_Var16;
    if (!bVar21) {
      bVar21 = false;
      local_d8 = p_Var16;
      do {
        local_d0._0_8_ = local_a0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
          ::_S_vtable._M_arr[(long)(char)p_Var10[2]._M_color + 1]._M_data)
                  ((anon_class_8_1_8991fb9c *)&local_d0,
                   (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    *)(p_Var10 + 1));
        if (local_98.size_ < 2) {
          EVar4 = Statement::eval(local_e0->body,local_e8);
        }
        else {
          sVar22 = nonstd::span_lite::
                   span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
                   subspan(&local_98,1,0xffffffffffffffff);
          p_Var16 = local_d8;
          EVar4 = evalRecursive(local_e0,local_e8,(ConstantValue *)&p_Var10[2]._M_parent,sVar22);
        }
        if ((EVar4 == Continue) || (pEVar15 = (EvalContext *)(ulong)EVar4, EVar4 == Success)) {
          pEVar15 = (EvalContext *)((ulong)context & 0xffffffff);
        }
        EVar7 = (ER)pEVar15;
        if ((EVar4 != Continue) && (EVar4 != Success)) break;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        bVar21 = p_Var10 == p_Var16;
        context = pEVar15;
      } while (!bVar21);
    }
    if (!bVar21) {
      return EVar7;
    }
    break;
  case '\b':
    pvVar11 = std::
              get<8ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        (&cv->value);
    pSVar1 = pvVar11->ptr;
    local_88 = &(pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                _M_impl.super__Deque_impl_data._M_start;
    for (aVar17.val = 0;
        ppCVar2 = (pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                  .super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node,
        pvVar19 = (void *)(((long)(pSVar1->
                                  super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                  ).
                                  super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)(pSVar1->
                                  super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                  ).
                                  super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                           -0x3333333333333333 +
                          ((long)(pSVar1->
                                 super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                 ).
                                 super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                           (long)(pSVar1->
                                 super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                 ).
                                 super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                          -0x3333333333333333 +
                          (((long)ppCVar2 -
                            (long)(pSVar1->
                                  super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                  ).
                                  super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                          (ulong)(ppCVar2 == (_Map_pointer)0x0)) * 0xc), aVar17.val < pvVar19;
        aVar17.pVal = (uint64_t *)(aVar17.val + 1)) {
      local_f0 = 0x20;
      local_ec = 1;
      local_f8 = aVar17;
      SVInt::clearUnusedBits((SVInt *)&local_f8);
      local_d0._0_8_ = local_f8;
      local_d0._8_4_ = local_f0;
      local_d0._12_1_ = (undefined1)local_ec;
      local_d0._13_1_ = local_ec._1_1_;
      if (0x40 < local_f0 || (local_ec & 0x100) != 0) {
        local_f8.val = 0;
      }
      local_b0 = 1;
      local_a8 = local_a0;
      std::operator=(&local_a8,&local_d0,&local_f9);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_d0);
      if (((0x40 < local_f0) || ((local_ec & 0x100) != 0)) && ((void *)local_f8.val != (void *)0x0))
      {
        operator_delete__(local_f8.pVal);
      }
      if (local_98.size_ < 2) {
        EVar4 = Statement::eval(local_e0->body,local_e8);
      }
      else {
        cv_00 = std::
                _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
                ::operator[](local_88,aVar17.val);
        local_80 = aVar17;
        sVar22 = nonstd::span_lite::
                 span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
                 subspan(&local_98,1,0xffffffffffffffff);
        aVar17 = local_80;
        EVar4 = evalRecursive(local_e0,local_e8,cv_00,sVar22);
      }
      if ((EVar4 == Continue) || (EVar7 = EVar4, EVar4 == Success)) {
        EVar7 = (ER)local_d8;
      }
      if ((EVar4 != Continue) && (EVar4 != Success)) goto LAB_0027ff7d;
      local_d8 = (_Rb_tree_node_base *)CONCAT44(local_d8._4_4_,EVar7);
    }
    EVar7 = (ER)local_d8;
LAB_0027ff7d:
    if (aVar17.val < pvVar19) {
      return EVar7;
    }
    break;
  default:
    local_78 = (pointer)0x0;
    local_68 = (void *)0x0;
LAB_0027fd0b:
    if ((pLVar14->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_engaged == true) {
      CVar20 = (pLVar14->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value;
      uVar5 = CVar20.right;
      bVar21 = (int)uVar5 <= CVar20.left;
    }
    else {
      uVar5 = (int)local_68 - 1;
      CVar20.left = 0;
      CVar20.right = 0;
      bVar21 = false;
    }
    iVar18 = CVar20.left;
    EVar4 = (ER)((int)uVar5 <= iVar18);
    bVar3 = iVar18 <= (int)uVar5;
    if (bVar21) {
      bVar3 = (int)uVar5 <= iVar18;
    }
    if (bVar3) {
      local_70 = (void *)((ulong)uVar5 | (long)CVar20 << 0x20);
      aVar17 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)iVar18;
      local_80.val = -(ulong)bVar21 | 1;
      local_88 = (_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
                  *)(long)(int)uVar5;
      bVar3 = true;
      local_60 = pLVar14;
      do {
        local_f0 = 0x20;
        local_ec = 1;
        local_f8 = aVar17;
        SVInt::clearUnusedBits((SVInt *)&local_f8);
        local_d0._0_8_ = local_f8;
        local_d0._8_4_ = local_f0;
        local_d0._12_1_ = (undefined1)local_ec;
        local_d0._13_1_ = local_ec._1_1_;
        if (0x40 < local_f0 || (local_ec & 0x100) != 0) {
          local_f8.val = 0;
        }
        local_b0 = 1;
        local_a8 = local_a0;
        std::operator=(&local_a8,&local_d0,&local_f9);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_d0);
        if (((0x40 < local_f0) || ((local_ec & 0x100) != 0)) &&
           ((void *)local_f8.val != (void *)0x0)) {
          operator_delete__(local_f8.pVal);
        }
        if (local_98.size_ < 2) {
          EVar7 = Statement::eval(local_e0->body,local_e8);
        }
        else {
          aVar13 = aVar17;
          if ((local_60->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ConstantRange>._M_engaged == true) {
            local_d0._0_8_ = local_70;
            iVar6 = ConstantRange::translateIndex((ConstantRange *)&local_d0,CVar20.left);
            aVar13 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)iVar6;
          }
          if (local_68 == (void *)0x0) {
            local_b0 = 0;
          }
          else {
            if (local_68 <= aVar13.val) goto LAB_0027ff93;
            std::__detail::__variant::
            _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_d0,
                              (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)(local_78 + aVar13.val));
          }
          sVar22 = nonstd::span_lite::
                   span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
                   subspan(&local_98,1,0xffffffffffffffff);
          EVar7 = evalRecursive(local_e0,local_e8,(ConstantValue *)&local_d0,sVar22);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_d0);
        }
        if ((EVar7 == Continue) || (EVar4 = EVar7, EVar7 == Success)) {
          EVar4 = (ER)local_d8;
        }
        if ((EVar7 != Continue) && (EVar7 != Success)) break;
        aVar17.val = aVar17.val + local_80.val;
        bVar3 = (long)aVar17.val <= (long)local_88;
        if (bVar21) {
          bVar3 = (long)local_88 <= (long)aVar17.val;
        }
        CVar20.left = CVar20.left + (int)local_80.val;
        CVar20.right = 0;
        local_d8 = (_Rb_tree_node_base *)CONCAT44(local_d8._4_4_,EVar4);
      } while (bVar3);
    }
    if (bVar3) {
      return EVar4;
    }
  }
  return Success;
}

Assistant:

ER ForeachLoopStatement::evalRecursive(EvalContext& context, const ConstantValue& cv,
                                       span<const LoopDim> currDims) const {
    // If there is no loop var just skip this index.
    auto& dim = currDims[0];
    if (!dim.loopVar) {
        // Shouldn't ever be at the end here.
        return evalRecursive(context, nullptr, currDims.subspan(1));
    }

    auto local = context.createLocal(dim.loopVar);

    // If this is an associative array, looping happens over the keys.
    if (cv.isMap()) {
        auto& map = *cv.map();
        for (auto& [key, val] : map) {
            *local = key;

            ER result;
            if (currDims.size() > 1)
                result = evalRecursive(context, val, currDims.subspan(1));
            else
                result = body.eval(context);

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else if (cv.isQueue()) {
        auto& q = *cv.queue();
        for (size_t i = 0; i < q.size(); i++) {
            *local = SVInt(32, i, true);

            ER result;
            if (currDims.size() > 1)
                result = evalRecursive(context, q[i], currDims.subspan(1));
            else
                result = body.eval(context);

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else if (cv.isString()) {
        ASSERT(currDims.size() == 1);

        auto& str = cv.str();
        for (size_t i = 0; i < str.size(); i++) {
            *local = SVInt(32, i, true);

            ER result = body.eval(context);
            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else {
        span<const ConstantValue> elements;
        if (cv.isUnpacked())
            elements = cv.elements();

        ConstantRange range;
        bool isLittleEndian;
        if (dim.range) {
            range = *dim.range;
            isLittleEndian = range.isLittleEndian();
        }
        else {
            range = {0, int32_t(elements.size()) - 1};
            isLittleEndian = false;
        }

        for (int32_t i = range.left; isLittleEndian ? i >= range.right : i <= range.right;
             isLittleEndian ? i-- : i++) {

            *local = SVInt(32, uint64_t(i), true);

            ER result;
            if (currDims.size() > 1) {
                size_t index = size_t(i);
                if (dim.range)
                    index = (size_t)range.reverse().translateIndex(i);

                result = evalRecursive(context, elements.empty() ? nullptr : elements[index],
                                       currDims.subspan(1));
            }
            else {
                result = body.eval(context);
            }

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }

    return ER::Success;
}